

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.h
# Opt level: O2

imath_half_bits_t imath_float_to_half(float f)

{
  char cVar1;
  ushort uVar2;
  float fVar3;
  uint uVar4;
  
  fVar3 = ABS(f);
  uVar2 = (ushort)((uint)f >> 0x10) & 0x8000;
  if ((uint)fVar3 < 0x38800000) {
    if ((0x33000000 < (uint)fVar3) &&
       (uVar4 = (uint)f & 0x7fffff | 0x800000, cVar1 = (char)((uint)fVar3 >> 0x17),
       uVar2 = uVar2 | (ushort)(uVar4 >> (0x7eU - cVar1 & 0x1f)),
       0x80000000 < uVar4 << (cVar1 + 0xa2U & 0x1f))) {
      return uVar2 + 1;
    }
  }
  else if ((uint)fVar3 < 0x7f800000) {
    if (0x477fefff < (uint)fVar3) {
      return uVar2 | 0x7c00;
    }
    uVar2 = (ushort)((int)fVar3 + 0x8000fffU + (uint)(((uint)fVar3 >> 0xd & 1) != 0) >> 0xd) | uVar2
    ;
  }
  else {
    uVar2 = uVar2 | 0x7c00;
    if (fVar3 != INFINITY) {
      uVar4 = (uint)fVar3 >> 0xd & 0x3ff;
      return uVar2 | (ushort)uVar4 | (ushort)(uVar4 == 0);
    }
  }
  return uVar2;
}

Assistant:

static inline imath_half_bits_t
imath_float_to_half (float f)
{
#if defined(__F16C__)
#    ifdef _MSC_VER
    // msvc does not seem to have cvtsh_ss :(
    return _mm_extract_epi16 (
        _mm_cvtps_ph (
            _mm_set_ss (f), (_MM_FROUND_TO_NEAREST_INT)),
        0);
#    else
    // preserve the fixed rounding mode to nearest
    return _cvtss_sh (f, (_MM_FROUND_TO_NEAREST_INT | _MM_FROUND_NO_EXC));
#    endif
#else
    imath_half_uif_t  v;
    imath_half_bits_t ret;
    uint32_t          e, m, ui, r, shift;

    v.f = f;

    ui  = (v.i & ~0x80000000);
    ret = ((v.i >> 16) & 0x8000);

    // exponent large enough to result in a normal number, round and return
    if (ui >= 0x38800000)
    {
        // inf or nan
        if (IMATH_UNLIKELY (ui >= 0x7f800000))
        {
            ret |= 0x7c00;
            if (ui == 0x7f800000) return ret;
            m = (ui & 0x7fffff) >> 13;
            // make sure we have at least one bit after shift to preserve nan-ness
            return ret | (uint16_t) m | (uint16_t) (m == 0);
        }

        // too large, round to infinity
        if (IMATH_UNLIKELY (ui > 0x477fefff))
        {
#    ifdef IMATH_HALF_ENABLE_FP_EXCEPTIONS
            feraiseexcept (FE_OVERFLOW);
#    endif
            return ret | 0x7c00;
        }

        ui -= 0x38000000;
        ui = ((ui + 0x00000fff + ((ui >> 13) & 1)) >> 13);
        return ret | (uint16_t) ui;
    }

    // zero or flush to 0
    if (ui < 0x33000001)
    {
#    ifdef IMATH_HALF_ENABLE_FP_EXCEPTIONS
        if (ui == 0) return ret;
        feraiseexcept (FE_UNDERFLOW);
#    endif
        return ret;
    }

    // produce a denormalized half
    e     = (ui >> 23);
    shift = 0x7e - e;
    m     = 0x800000 | (ui & 0x7fffff);
    r     = m << (32 - shift);
    ret |= (m >> shift);
    if (r > 0x80000000 || (r == 0x80000000 && (ret & 0x1) != 0)) ++ret;
    return ret;
#endif
}